

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O2

RK_S32 mpp_slots_get_unused_count(MppBufSlots slots)

{
  int iVar1;
  RK_S32 RVar2;
  AutoMutex auto_lock;
  
  if (slots == (MppBufSlots)0x0) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_slots_get_unused_count");
    RVar2 = -3;
  }
  else {
    auto_lock.mLock = *slots;
    auto_lock.mEnabled = 1;
    if ((pthread_mutex_t *)auto_lock.mLock != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)auto_lock.mLock);
    }
    iVar1 = *(int *)((long)slots + 100);
    if ((iVar1 < 0) ||
       (RVar2 = *(int *)((long)slots + 0x60) - iVar1, *(int *)((long)slots + 0x60) < iVar1)) {
      _dump_slots("mpp_slots_get_unused_count",(MppBufSlotsImpl *)slots);
      _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "(impl->used_count >= 0) && (impl->used_count <= impl->buf_count)",
                 "mpp_slots_get_unused_count",0x53c);
      abort();
    }
    Mutex::Autolock::~Autolock(&auto_lock);
  }
  return RVar2;
}

Assistant:

RK_S32 mpp_slots_get_unused_count(MppBufSlots slots)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    slot_assert(impl, (impl->used_count >= 0) && (impl->used_count <= impl->buf_count));
    return impl->buf_count - impl->used_count;
}